

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void out_init(void)

{
  outflag = 1;
  outcnt = 0;
  hidout = 0;
  G_user_filter = 0xffff;
  G_std_disp.linepos = '\0';
  G_std_disp.linecol = '\0';
  G_std_disp.linebuf[0] = '\0';
  G_std_disp.linecnt = 0;
  G_std_disp.capturing = 0;
  G_std_disp._10256_7_ = 0;
  G_std_disp._10263_4_ = 0;
  G_std_disp.capture_obj = 0xffff;
  G_std_disp.html_quote_level = 0;
  G_std_disp.html_pre_level = 0;
  G_std_disp.html_allow_alt = 0;
  G_std_disp.preview = 0;
  G_std_disp.just_did_nl = 0;
  G_std_disp.html_target = 0;
  G_std_disp.plain_text_target = 0;
  G_std_disp.html_mode = 0;
  G_std_disp.html_mode_flag = 0;
  G_std_disp.html_defer_br = 0;
  G_std_disp.html_in_ignore = 0;
  G_std_disp.html_in_title = 0;
  G_std_disp.do_print = do_std_print;
  G_std_disp.use_more_mode = 1;
  G_std_disp.os_line_wrap = 0;
  G_log_disp.linepos = '\0';
  G_log_disp.linecol = '\0';
  G_log_disp.linebuf[0] = '\0';
  G_log_disp.linecnt = 0;
  G_log_disp.capturing = 0;
  G_log_disp._10256_7_ = 0;
  G_log_disp._10263_4_ = 0;
  G_log_disp.capture_obj = 0xffff;
  G_log_disp.html_quote_level = 0;
  G_log_disp.html_pre_level = 0;
  G_log_disp.html_allow_alt = 0;
  G_log_disp.html_mode = 0;
  G_log_disp.preview = 0;
  G_log_disp.just_did_nl = 0;
  G_log_disp.use_more_mode = 0;
  G_log_disp.os_line_wrap = 0;
  G_log_disp.html_mode_flag = 0;
  G_log_disp.html_defer_br = 0;
  G_log_disp.html_in_ignore = 0;
  G_log_disp.html_in_title = 0;
  G_log_disp.do_print = do_log_print;
  G_log_disp.html_target = 0;
  G_log_disp.plain_text_target = 1;
  return;
}

Assistant:

void out_init()
{
    /* not yet hiding output */
    outflag = 1;
    outcnt = 0;
    hidout = 0;

    /* initialize the standard display stream */
    out_init_std(&G_std_disp);

    /* initialize the log file stream */
    out_init_log(&G_log_disp);
}